

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t ismode(char *start,char *end,wchar_t *permset)

{
  byte bVar1;
  wchar_t wVar2;
  uint uVar3;
  ulong uVar4;
  
  if (start < end) {
    wVar2 = L'\0';
    while( true ) {
      *permset = wVar2;
      do {
        if (end <= start) {
          return L'\x01';
        }
        bVar1 = *start;
        start = (char *)((byte *)start + 1);
      } while (bVar1 == 0x2d);
      uVar3 = bVar1 - 0x52;
      uVar4 = (ulong)uVar3;
      if (0x26 < uVar3) break;
      if ((0x100000001U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x2000000020U >> (uVar4 & 0x3f) & 1) == 0) {
          if ((0x4000000040U >> (uVar4 & 0x3f) & 1) == 0) {
            return L'\0';
          }
          uVar3 = 1;
        }
        else {
          uVar3 = 2;
        }
      }
      else {
        uVar3 = 4;
      }
      wVar2 = wVar2 | uVar3;
    }
  }
  return L'\0';
}

Assistant:

static int
ismode(const char *start, const char *end, int *permset)
{
	const char *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case 'r': case 'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case 'w': case 'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case 'x': case 'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case '-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}